

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O2

void __thiscall
iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription::addJacobianBlock
          (MultipleShootingTranscription *this,size_t initRow,size_t initCol,
          SparsityStructure *sparsity)

{
  size_t sVar1;
  size_t i;
  ulong index;
  NonZero NVar2;
  
  index = 0;
  while( true ) {
    sVar1 = SparsityStructure::size(sparsity);
    if (sVar1 <= index) break;
    sVar1 = this->m_jacobianNonZeros;
    NVar2 = SparsityStructure::operator[](sparsity,index);
    addNonZero(this,&this->m_jacobianNZRows,sVar1,initRow + NVar2.row);
    sVar1 = this->m_jacobianNonZeros;
    NVar2 = SparsityStructure::operator[](sparsity,index);
    addNonZero(this,&this->m_jacobianNZCols,sVar1,NVar2.col + initCol);
    this->m_jacobianNonZeros = this->m_jacobianNonZeros + 1;
    index = index + 1;
  }
  return;
}

Assistant:

void addJacobianBlock(size_t initRow, size_t initCol, const SparsityStructure& sparsity){
                for (size_t i = 0; i < sparsity.size(); ++i) {
                    addNonZero(m_jacobianNZRows, m_jacobianNonZeros, initRow + sparsity[i].row);
                    addNonZero(m_jacobianNZCols, m_jacobianNonZeros, initCol + sparsity[i].col);
                    m_jacobianNonZeros++;
                }
            }